

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Token * __thiscall wabt::WastParser::GetToken(Token *__return_storage_ptr__,WastParser *this)

{
  optional<wabt::Token> *poVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  size_t sVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  Token local_58;
  
  if ((this->tokens_).tokens._M_elems[(this->tokens_).i].
      super__Optional_base<wabt::Token,_true,_true>._M_payload.
      super__Optional_payload_base<wabt::Token>._M_engaged == false) {
    WastLexer::GetToken(&local_58,this->lexer_);
    uVar11 = (ulong)(this->tokens_).i;
    uVar10 = uVar11 ^ 1;
    if ((this->tokens_).tokens._M_elems[uVar10].super__Optional_base<wabt::Token,_true,_true>.
        _M_payload.super__Optional_payload_base<wabt::Token>._M_engaged == true) {
      __assert_fail("!tokens[!i]",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                    ,0xf1b,"void wabt::WastParser::TokenQueue::push_back(Token)");
    }
    poVar1 = (this->tokens_).tokens._M_elems + uVar10;
    *(char **)((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
                      super__Optional_payload_base<wabt::Token>._M_payload + 0x30) =
         local_58.field_2.text_._M_str;
    *(char **)((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
                      super__Optional_payload_base<wabt::Token>._M_payload + 0x38) =
         local_58.field_2.literal_.text._M_str;
    *(undefined8 *)
     ((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
             super__Optional_payload_base<wabt::Token>._M_payload + 0x20) = local_58._32_8_;
    *(size_t *)
     ((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
             super__Optional_payload_base<wabt::Token>._M_payload + 0x28) =
         local_58.field_2.text_._M_len;
    ((anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
    ((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
            super__Optional_payload_base<wabt::Token>._M_payload + 0x10))->offset =
         (size_t)local_58.loc.field_1.field_1.offset;
    *(undefined8 *)
     ((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
             super__Optional_payload_base<wabt::Token>._M_payload + 0x18) =
         local_58.loc.field_1._8_8_;
    *(size_t *)
     &(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
      super__Optional_payload_base<wabt::Token>._M_payload = local_58.loc.filename._M_len;
    *(char **)((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
                      super__Optional_payload_base<wabt::Token>._M_payload + 8) =
         local_58.loc.filename._M_str;
    (poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
    super__Optional_payload_base<wabt::Token>._M_engaged = true;
    if ((this->tokens_).tokens._M_elems[uVar11].super__Optional_base<wabt::Token,_true,_true>.
        _M_payload.super__Optional_payload_base<wabt::Token>._M_engaged == false) {
      (this->tokens_).i = SUB81(uVar10,0);
    }
  }
  bVar2 = (this->tokens_).i;
  if ((this->tokens_).tokens._M_elems[bVar2].super__Optional_base<wabt::Token,_true,_true>.
      _M_payload.super__Optional_payload_base<wabt::Token>._M_engaged != false) {
    poVar1 = (this->tokens_).tokens._M_elems + bVar2;
    sVar3 = *(size_t *)
             &(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
              super__Optional_payload_base<wabt::Token>._M_payload;
    pcVar4 = *(char **)((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
                               super__Optional_payload_base<wabt::Token>._M_payload + 8);
    sVar5 = *(size_t *)
             ((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
                     super__Optional_payload_base<wabt::Token>._M_payload + 0x10);
    uVar6 = *(undefined8 *)
             ((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
                     super__Optional_payload_base<wabt::Token>._M_payload + 0x18);
    uVar7 = *(undefined8 *)
             ((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
                     super__Optional_payload_base<wabt::Token>._M_payload + 0x20);
    sVar8 = *(size_t *)
             ((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
                     super__Optional_payload_base<wabt::Token>._M_payload + 0x28);
    pcVar9 = *(char **)((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
                               super__Optional_payload_base<wabt::Token>._M_payload + 0x38);
    (__return_storage_ptr__->field_2).text_._M_str =
         *(char **)((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
                           super__Optional_payload_base<wabt::Token>._M_payload + 0x30);
    (__return_storage_ptr__->field_2).literal_.text._M_str = pcVar9;
    *(undefined8 *)&__return_storage_ptr__->token_type_ = uVar7;
    (__return_storage_ptr__->field_2).text_._M_len = sVar8;
    (__return_storage_ptr__->loc).field_1.field_1.offset = sVar5;
    *(undefined8 *)((long)&(__return_storage_ptr__->loc).field_1 + 8) = uVar6;
    (__return_storage_ptr__->loc).filename._M_len = sVar3;
    (__return_storage_ptr__->loc).filename._M_str = pcVar4;
    return __return_storage_ptr__;
  }
  std::__throw_bad_optional_access();
}

Assistant:

Token WastParser::GetToken() {
  if (tokens_.empty()) {
    tokens_.push_back(lexer_->GetToken());
  }
  return tokens_.front();
}